

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flowtest.cc
# Opt level: O0

string * __thiscall
flowtest::join_abi_cxx11_
          (string *__return_storage_ptr__,flowtest *this,initializer_list<flowtest::Token> *tokens)

{
  ulong uVar1;
  string_view local_80;
  string local_70;
  Token local_3c;
  const_iterator pTStack_38;
  Token t;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<flowtest::Token> *__range1;
  initializer_list<flowtest::Token> *local_18;
  initializer_list<flowtest::Token> *tokens_local;
  string *s;
  
  __range1._7_1_ = 0;
  local_18 = (initializer_list<flowtest::Token> *)this;
  tokens_local = (initializer_list<flowtest::Token> *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __begin1 = (const_iterator)local_18;
  __end1 = std::initializer_list<flowtest::Token>::begin(local_18);
  pTStack_38 = std::initializer_list<flowtest::Token>::end
                         ((initializer_list<flowtest::Token> *)__begin1);
  for (; __end1 != pTStack_38; __end1 = __end1 + 1) {
    local_3c = *__end1;
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    }
    fmt::v5::basic_string_view<char>::basic_string_view(&local_80,"{}");
    fmt::v5::format<flowtest::Token>(&local_70,local_80,&local_3c);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string join(const std::initializer_list<Token>& tokens) {
  std::string s;
  for (Token t: tokens) {
    if (!s.empty())
      s += ", ";
    s += fmt::format("{}", t);
  }
  return s;
}